

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_helpers.cpp
# Opt level: O1

string * camel_case_to_underscore(string *__return_storage_ptr__,string *s)

{
  size_type sVar1;
  size_type sVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  sVar1 = s->_M_string_length;
  if (sVar1 != 0) {
    sVar2 = 0;
    do {
      if (((byte)((s->_M_dataplus)._M_p[sVar2] + 0xbfU) < 0x1a) && (sVar2 != 0)) {
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
      sVar2 = sVar2 + 1;
    } while (sVar1 != sVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string camel_case_to_underscore(const std::string &s) {
  std::string ret;
  for (size_t i = 0, end = s.size(); i < end; i++) {
    char x = s[i];
    if (x >= 'A' && x <= 'Z') {
      if (i != 0) {
        ret += '_';
      }
      ret += (char)(x | 32);
    } else {
      ret += x;
    }
  }
  return ret;
}